

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O2

void __thiscall google::protobuf::UnknownFieldSet::~UnknownFieldSet(UnknownFieldSet *this)

{
  Clear(this);
  RepeatedField<google::protobuf::UnknownField>::~RepeatedField(&this->fields_);
  return;
}

Assistant:

inline UnknownFieldSet::~UnknownFieldSet() { Clear(); }